

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<void_(*)(void_*)>::relocate
          (QArrayDataPointer<void_(*)(void_*)> *this,qsizetype offset,_func_void_void_ptr ***data)

{
  bool bVar1;
  _func_void_void_ptr **first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  _func_void_void_ptr **res;
  
  first = (_func_void_void_ptr **)(*(long *)(in_RDI + 8) + in_RSI * 8);
  QtPrivate::q_relocate_overlap_n<void(*)(void*),long_long>
            (first,in_RDI,(_func_void_void_ptr **)0x6d8587);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<void(*)(void*)>,void(*const*)(void*)>
                        (data,(QArrayDataPointer<void_(*)(void_*)> *)res), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  *(_func_void_void_ptr ***)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }